

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.cpp
# Opt level: O3

void __thiscall Jupiter::Config::Config(Config *this,Config *in_config)

{
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>,_std::__detail::_Select1st,_jessilib::text_equali,_jessilib::text_hashi,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *__ht;
  size_t sVar1;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Jupiter::Config>,std::allocator<std::pair<std::__cxx11::string_const,Jupiter::Config>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *this_00;
  __alloc_node_gen_t __alloc_node_gen;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>,_false>_>_>
  local_28;
  
  this->_vptr_Config = (_func_int **)&PTR_read_internal_001461a0;
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  (this->m_name)._M_string_length = 0;
  (this->m_name).field_2._M_local_buf[0] = '\0';
  (this->m_table)._M_h._M_buckets = &(this->m_table)._M_h._M_single_bucket;
  (this->m_table)._M_h._M_bucket_count = 1;
  (this->m_table)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_table)._M_h._M_element_count = 0;
  (this->m_table)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_table)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_table)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  __ht = &((in_config->m_sections)._M_t.
           super___uniq_ptr_impl<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>_*,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>_>_>
           .
           super__Head_base<0UL,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>_*,_false>
          ._M_head_impl)->_M_h;
  this_00 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Jupiter::Config>,std::allocator<std::pair<std::__cxx11::string_const,Jupiter::Config>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
             *)operator_new(0x38);
  *(undefined8 *)&this_00->field_0x0 = 0;
  *(size_type *)(this_00 + 8) = __ht->_M_bucket_count;
  *(undefined8 *)(this_00 + 0x10) = 0;
  *(size_type *)(this_00 + 0x18) = __ht->_M_element_count;
  sVar1 = *(size_t *)((long)&__ht->_M_rehash_policy + 8);
  *(undefined8 *)(this_00 + 0x20) = *(undefined8 *)&__ht->_M_rehash_policy;
  *(size_t *)(this_00 + 0x28) = sVar1;
  *(undefined8 *)(this_00 + 0x30) = 0;
  local_28._M_h = (__hashtable_alloc *)this_00;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Jupiter::Config>,std::allocator<std::pair<std::__cxx11::string_const,Jupiter::Config>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,Jupiter::Config>,std::allocator<std::pair<std::__cxx11::string_const,Jupiter::Config>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,Jupiter::Config>,false>>>>
            (this_00,__ht,&local_28);
  (this->m_sections)._M_t.
  super___uniq_ptr_impl<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>_*,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>_>_>
  .
  super__Head_base<0UL,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>_*,_false>
  ._M_head_impl =
       (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>
        *)this_00;
  return;
}

Assistant:

Jupiter::Config::Config(const Config& in_config)
	: m_sections{ std::make_unique<SectionHashTable>(*in_config.m_sections) } {
}